

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

void __thiscall
HVectorBase<HighsCDouble>::saxpy<double,HighsCDouble>
          (HVectorBase<HighsCDouble> *this,double pivotX,HVectorBase<HighsCDouble> *pivot)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pHVar4;
  pointer piVar5;
  pointer pHVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  HighsCDouble HVar15;
  
  iVar8 = this->count;
  iVar1 = pivot->count;
  if (0 < (long)iVar1) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar4 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar6 = (pivot->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar2 = piVar5[lVar9];
      dVar14 = pHVar4[iVar2].hi;
      dVar11 = pHVar4[iVar2].lo;
      HVar15 = HighsCDouble::operator*(pHVar6 + iVar2,pivotX);
      dVar12 = dVar14 + dVar11;
      if ((dVar12 == 0.0) && (!NAN(dVar12))) {
        lVar7 = (long)iVar8;
        iVar8 = iVar8 + 1;
        piVar3[lVar7] = iVar2;
      }
      dVar12 = dVar14 + HVar15.hi;
      dVar11 = HVar15.lo +
               dVar11 + (HVar15.hi - (dVar12 - dVar14)) + (dVar14 - (dVar12 - (dVar12 - dVar14)));
      dVar14 = dVar11;
      if (dVar12 + dVar11 < 0.0) {
        dVar14 = -dVar11;
      }
      uVar10 = -(ulong)(dVar12 + dVar11 < 0.0);
      dVar14 = (double)(~uVar10 & (ulong)dVar12 | (ulong)-dVar12 & uVar10) + dVar14;
      dVar13 = 0.0;
      if (1e-14 <= dVar14) {
        dVar13 = dVar11;
      }
      uVar10 = -(ulong)(dVar14 < 1e-14);
      pHVar4[iVar2].hi = (double)(~uVar10 & (ulong)dVar12 | uVar10 & 0x358dee7a4ad4b81f);
      pHVar4[iVar2].lo = dVar13;
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
  }
  this->count = iVar8;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}